

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_use_port(Curl_easy *data,ftpport fcmd)

{
  char cVar1;
  unsigned_short uVar2;
  int iVar3;
  CURLcode CVar4;
  uint uVar5;
  if2ip_result_t iVar6;
  connectdata *conn;
  size_t sVar7;
  char *__dest;
  char *pcVar8;
  int *piVar9;
  ulong uVar10;
  undefined6 extraout_var;
  long lVar11;
  Curl_addrinfo *ai;
  char cVar12;
  connectdata *pcVar13;
  size_t sVar14;
  ftpport fVar15;
  ushort uVar16;
  uint uVar17;
  char *pcVar18;
  curl_socket_t portsock;
  curl_socklen_t sslen;
  Curl_dns_entry *h;
  char myhost [47];
  Curl_sockaddr_storage ss;
  char target [67];
  char buffer [256];
  char hbuf [1025];
  curl_socket_t local_668;
  socklen_t local_664;
  ftpport local_660;
  uint local_65c;
  connectdata *local_658;
  undefined4 local_64c;
  pingpong *local_648;
  Curl_dns_entry *local_640;
  char local_638 [48];
  sockaddr local_608 [8];
  char local_588 [80];
  char local_538 [256];
  char local_438 [1032];
  
  pcVar13 = data->conn;
  local_668 = -1;
  local_638[0x20] = '\0';
  local_638[0x21] = '\0';
  local_638[0x22] = '\0';
  local_638[0x23] = '\0';
  local_638[0x24] = '\0';
  local_638[0x25] = '\0';
  local_638[0x26] = '\0';
  local_638[0x27] = '\0';
  local_638[0x28] = '\0';
  local_638[0x29] = '\0';
  local_638[0x2a] = '\0';
  local_638[0x2b] = '\0';
  local_638[0x2c] = '\0';
  local_638[0x2d] = '\0';
  local_638[0x2e] = '\0';
  local_638[0x10] = '\0';
  local_638[0x11] = '\0';
  local_638[0x12] = '\0';
  local_638[0x13] = '\0';
  local_638[0x14] = '\0';
  local_638[0x15] = '\0';
  local_638[0x16] = '\0';
  local_638[0x17] = '\0';
  local_638[0x18] = '\0';
  local_638[0x19] = '\0';
  local_638[0x1a] = '\0';
  local_638[0x1b] = '\0';
  local_638[0x1c] = '\0';
  local_638[0x1d] = '\0';
  local_638[0x1e] = '\0';
  local_638[0x1f] = 0;
  local_638[0] = '\0';
  local_638[1] = '\0';
  local_638[2] = '\0';
  local_638[3] = '\0';
  local_638[4] = '\0';
  local_638[5] = '\0';
  local_638[6] = '\0';
  local_638[7] = '\0';
  local_638[8] = '\0';
  local_638[9] = '\0';
  local_638[10] = '\0';
  local_638[0xb] = '\0';
  local_638[0xc] = '\0';
  local_638[0xd] = '\0';
  local_638[0xe] = '\0';
  local_638[0xf] = '\0';
  pcVar18 = (data->set).str[0xc];
  local_640 = (Curl_dns_entry *)0x0;
  if ((pcVar18 == (char *)0x0) || (sVar7 = strlen(pcVar18), sVar7 < 2)) {
    __dest = (char *)0x0;
    uVar16 = 0;
    uVar5 = 0;
LAB_00508334:
    local_664 = 0x80;
    iVar3 = getsockname(pcVar13->sock[0],local_608,&local_664);
    if (iVar3 != 0) {
      piVar9 = __errno_location();
      pcVar18 = Curl_strerror(*piVar9,local_538,0x100);
      pcVar8 = "getsockname() failed: %s";
      goto LAB_0050847a;
    }
    local_65c = uVar5;
    pcVar18 = inet_ntop((uint)local_608[0].sa_family,
                        local_608[0].sa_data + (ulong)(local_608[0].sa_family == 10) * 4 + 2,
                        local_438,0x401);
    if (pcVar18 == (char *)0x0) {
      return CURLE_FTP_PORT_FAILED;
    }
    local_64c = 0;
    pcVar18 = local_438;
    local_660 = fcmd;
  }
  else {
    sVar14 = 0x2f;
    if (0x2d < sVar7) {
      sVar14 = sVar7 + 1;
    }
    __dest = (char *)(*Curl_ccalloc)(sVar14,1);
    if (__dest == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar8 = pcVar18;
    if (*pcVar18 == ':') {
LAB_005084f7:
      pcVar18 = strchr(pcVar8,0x3a);
      if (pcVar18 == (char *)0x0) goto LAB_0050855d;
      uVar10 = strtoul(pcVar18 + 1,(char **)0x0,10);
      uVar2 = curlx_ultous(uVar10);
      pcVar18 = strchr(pcVar18,0x2d);
      uVar5 = (uint)CONCAT62(extraout_var,uVar2);
      uVar17 = uVar5;
      if (pcVar18 != (char *)0x0) {
        uVar10 = strtoul(pcVar18 + 1,(char **)0x0,10);
        uVar2 = curlx_ultous(uVar10);
        uVar17 = (uint)uVar2;
      }
    }
    else {
      if (*pcVar18 == '[') {
        pcVar8 = strchr(pcVar18,0x5d);
        if (pcVar8 != (char *)0x0) {
          pcVar18 = pcVar18 + 1;
LAB_005084e3:
          strncpy(__dest,pcVar18,(long)pcVar8 - (long)pcVar18);
          goto LAB_005084f7;
        }
      }
      else {
        pcVar8 = strchr(pcVar18,0x3a);
        if ((pcVar8 != (char *)0x0) && (iVar3 = inet_pton(10,pcVar18,local_608), iVar3 != 1))
        goto LAB_005084e3;
        strcpy(__dest,pcVar18);
      }
LAB_0050855d:
      uVar5 = 0;
      uVar17 = 0;
    }
    uVar16 = (ushort)uVar17;
    if (uVar16 < (ushort)uVar5) {
      uVar5 = 0;
      uVar16 = 0;
    }
    if (*__dest == '\0') goto LAB_00508334;
    iVar3 = pcVar13->ip_addr->ai_family;
    local_660 = fcmd;
    local_65c = uVar5;
    uVar5 = Curl_ipv6_scope(pcVar13->ip_addr->ai_addr);
    pcVar18 = __dest;
    iVar6 = Curl_if2ip(iVar3,uVar5,pcVar13->scope_id,__dest,local_438,0x401);
    local_64c = (undefined4)CONCAT71((int7)((ulong)pcVar18 >> 8),1);
    pcVar18 = __dest;
    if (iVar6 != IF2IP_NOT_FOUND) {
      if (iVar6 == IF2IP_AF_NOT_SUPPORTED) {
        return CURLE_FTP_PORT_FAILED;
      }
      pcVar18 = local_438;
      uVar5 = local_65c;
      fcmd = local_660;
      if (iVar6 != IF2IP_FOUND) goto LAB_00508334;
    }
  }
  Curl_resolv(data,pcVar18,0,false,&local_640);
  if (local_640 != (Curl_dns_entry *)0x0) {
    ai = local_640->addr;
    Curl_resolv_unlock(data,local_640);
    if (ai != (Curl_addrinfo *)0x0) {
      local_648 = (pingpong *)&pcVar13->proto;
      (*Curl_cfree)(__dest);
      uVar5 = local_65c;
      local_668 = -1;
      while (CVar4 = Curl_socket(data,ai,(Curl_sockaddr_ex *)0x0,&local_668), CVar4 != CURLE_OK) {
        ai = ai->ai_next;
        if (ai == (Curl_addrinfo *)0x0) {
          piVar9 = __errno_location();
          pcVar18 = Curl_strerror(*piVar9,local_538,0x100);
          Curl_failf(data,"socket failure: %s",pcVar18);
          return CURLE_FTP_PORT_FAILED;
        }
      }
      local_658 = pcVar13;
      memcpy(local_608,ai->ai_addr,(ulong)ai->ai_addrlen);
      local_664 = ai->ai_addrlen;
      if (uVar16 < (ushort)uVar5) {
LAB_0050858c:
        Curl_failf(data,"bind() failed, we ran out of ports");
        pcVar13 = local_658;
      }
      else {
        uVar5 = local_65c;
        do {
          while( true ) {
            local_608[0].sa_data._0_2_ = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
            iVar3 = bind(local_668,local_608,local_664);
            if (iVar3 == 0) {
              local_664 = 0x80;
              iVar3 = getsockname(local_668,local_608,&local_664);
              if (iVar3 != 0) {
                piVar9 = __errno_location();
                iVar3 = *piVar9;
                goto LAB_0050872a;
              }
              iVar3 = listen(local_668,1);
              pcVar13 = local_658;
              if (iVar3 != 0) {
                piVar9 = __errno_location();
                pcVar18 = Curl_strerror(*piVar9,local_538,0x100);
                Curl_failf(data,"socket failure: %s",pcVar18);
                goto LAB_005085a9;
              }
              Curl_printable_address(ai,local_638,0x2f);
              uVar5 = *(uint *)&(pcVar13->bits).field_0x4;
              if ((uVar5 & 0x81000) == 0x1000) {
                uVar5 = uVar5 | 0x80000;
                *(uint *)&(pcVar13->bits).field_0x4 = uVar5;
              }
              iVar3 = 2;
              if (local_660 == DONE) goto LAB_00508874;
              fVar15 = local_660;
              goto LAB_00508837;
            }
            piVar9 = __errno_location();
            iVar3 = *piVar9;
            if ((iVar3 == 99 & (byte)local_64c) == 1) break;
            if ((iVar3 != 0xd) && (iVar3 != 0x62)) {
              pcVar18 = Curl_strerror(iVar3,local_538,0x100);
              Curl_failf(data,"bind(port=%hu) failed: %s",(ulong)(uVar5 & 0xffff),pcVar18);
              pcVar13 = local_658;
              goto LAB_005085a9;
            }
            uVar5 = uVar5 + 1;
            if (uVar16 < (ushort)uVar5) goto LAB_0050858c;
          }
          pcVar18 = Curl_strerror(99,local_538,0x100);
          local_64c = 0;
          Curl_infof(data,"bind(port=%hu) on non-local address failed: %s",(ulong)(uVar5 & 0xffff),
                     pcVar18);
          local_664 = 0x80;
          iVar3 = getsockname(local_658->sock[0],local_608,&local_664);
          uVar5 = local_65c;
        } while (iVar3 == 0);
        iVar3 = *piVar9;
LAB_0050872a:
        pcVar18 = Curl_strerror(iVar3,local_538,0x100);
        Curl_failf(data,"getsockname() failed: %s",pcVar18);
        pcVar13 = local_658;
      }
LAB_005085a9:
      Curl_closesocket(data,pcVar13,local_668);
      return CURLE_FTP_PORT_FAILED;
    }
  }
  pcVar8 = "failed to resolve the address provided to PORT: %s";
LAB_0050847a:
  Curl_failf(data,pcVar8,pcVar18);
  (*Curl_cfree)(__dest);
  return CURLE_FTP_PORT_FAILED;
LAB_00508837:
  if ((uVar5 & 0x80000) != 0 || fVar15 != EPRT) {
    if (fVar15 == PORT && local_608[0].sa_family != 2) goto LAB_00508874;
    if ((local_608[0].sa_family | 8) == 10) {
      if (fVar15 == EPRT) {
        iVar3 = 0;
        CVar4 = Curl_pp_sendf(data,local_648,"%s |%d|%s|%hu|",ftp_state_use_port::mode,
                              (ulong)((local_608[0].sa_family != 2) + 1),local_638,
                              (uint)(ushort)(local_608[0].sa_data._0_2_ << 8 |
                                            (ushort)local_608[0].sa_data._0_2_ >> 8));
        if (CVar4 != CURLE_OK) {
          pcVar18 = curl_easy_strerror(CVar4);
          Curl_failf(data,"Failure sending EPRT command: %s",pcVar18);
          Curl_closesocket(data,pcVar13,local_668);
          (pcVar13->proto).ftpc.count1 = 1;
          goto LAB_005089e2;
        }
        goto LAB_00508874;
      }
      if (fVar15 == PORT) {
        lVar11 = 0;
        while( true ) {
          cVar1 = local_638[lVar11];
          cVar12 = ',';
          if ((cVar1 != '.') && (cVar12 = cVar1, cVar1 == '\0')) break;
          local_588[lVar11] = cVar12;
          lVar11 = lVar11 + 1;
        }
        local_588[lVar11] = '\0';
        curl_msnprintf(local_588 + lVar11,0x14,",%d,%d",(ulong)(local_608[0].sa_data._0_2_ & 0xff),
                       (ulong)SUB21(local_608[0].sa_data._0_2_,1));
        CVar4 = Curl_pp_sendf(data,local_648,"%s %s",0x6d1e51,local_588);
        if (CVar4 != CURLE_OK) {
          pcVar18 = curl_easy_strerror(CVar4);
          Curl_failf(data,"Failure sending PORT command: %s",pcVar18);
          Curl_closesocket(data,local_658,local_668);
LAB_005089e2:
          (data->conn->proto).ftpc.state = FTP_STOP;
          return CVar4;
        }
        iVar3 = 1;
        pcVar13 = local_658;
LAB_00508874:
        (pcVar13->proto).ftpc.count1 = iVar3;
        if (pcVar13->sock[1] != -1) {
          Curl_closesocket(data,pcVar13,pcVar13->sock[1]);
        }
        (pcVar13->bits).proxy_ssl_connected[1] = false;
        pcVar13->sock[1] = local_668;
        (pcVar13->bits).tcpconnect[1] = true;
        (data->conn->proto).ftpc.state = FTP_PORT;
        return CURLE_OK;
      }
    }
  }
  fVar15 = fVar15 + PORT;
  if (fVar15 == DONE) goto LAB_00508874;
  goto LAB_00508837;
}

Assistant:

static CURLcode ftp_state_use_port(struct Curl_easy *data,
                                   ftpport fcmd) /* start with this */
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  curl_socket_t portsock = CURL_SOCKET_BAD;
  char myhost[MAX_IPADR_LEN + 1] = "";

  struct Curl_sockaddr_storage ss;
  struct Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa = (struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  static const char mode[][5] = { "EPRT", "PORT" };
  enum resolve_t rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *h = NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;
  char buffer[STRERROR_LEN];
  char *addr = NULL;

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {

#ifdef ENABLE_IPV6
    size_t addrlen = INET6_ADDRSTRLEN > strlen(string_ftpport) ?
      INET6_ADDRSTRLEN : strlen(string_ftpport);
#else
    size_t addrlen = INET_ADDRSTRLEN > strlen(string_ftpport) ?
      INET_ADDRSTRLEN : strlen(string_ftpport);
#endif
    char *ip_start = string_ftpport;
    char *ip_end = NULL;
    char *port_start = NULL;
    char *port_sep = NULL;

    addr = calloc(addrlen + 1, 1);
    if(!addr)
      return CURLE_OUT_OF_MEMORY;

#ifdef ENABLE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      ip_start = string_ftpport + 1;
      ip_end = strchr(string_ftpport, ']');
      if(ip_end)
        strncpy(addr, ip_start, ip_end - ip_start);
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
      }
      else {
        ip_end = strchr(string_ftpport, ':');
        if(ip_end) {
          /* either ipv6 or (ipv4|domain|interface):port(-range) */
#ifdef ENABLE_IPV6
          if(Curl_inet_pton(AF_INET6, string_ftpport, sa6) == 1) {
            /* ipv6 */
            port_min = port_max = 0;
            strcpy(addr, string_ftpport);
            ip_end = NULL; /* this got no port ! */
          }
          else
#endif
            /* (ipv4|domain|interface):port(-range) */
            strncpy(addr, string_ftpport, ip_end - ip_start);
        }
        else
          /* ipv4|interface */
          strcpy(addr, string_ftpport);
      }

    /* parse the port */
    if(ip_end) {
      port_start = strchr(ip_end, ':');
      if(port_start) {
        port_min = curlx_ultous(strtoul(port_start + 1, NULL, 10));
        port_sep = strchr(port_start, '-');
        if(port_sep) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711,  in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max)
      port_min = port_max = 0;


    if(*addr != '\0') {
      /* attempt to get the address of the given interface name */
      switch(Curl_if2ip(conn->ip_addr->ai_family,
#ifdef ENABLE_IPV6
                        Curl_ipv6_scope(conn->ip_addr->ai_addr),
                        conn->scope_id,
#endif
                        addr, hbuf, sizeof(hbuf))) {
        case IF2IP_NOT_FOUND:
          /* not an interface, use the given string as host name instead */
          host = addr;
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          return CURLE_FTP_PORT_FAILED;
        case IF2IP_FOUND:
          host = hbuf; /* use the hbuf for host name */
      }
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    const char *r;
    /* not an interface and not a host name, get default by extracting
       the IP from the control connection */
    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
            Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      free(addr);
      return CURLE_FTP_PORT_FAILED;
    }
    switch(sa->sa_family) {
#ifdef ENABLE_IPV6
    case AF_INET6:
      r = Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      r = Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    if(!r)
      return CURLE_FTP_PORT_FAILED;
    host = hbuf; /* use this host name */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(data, host, 0, FALSE, &h);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(data, &h);
  if(h) {
    res = h->addr;
    /* when we return from this function, we can forget about this entry
       to we can unlock it now already */
    Curl_resolv_unlock(data, h);
  } /* (h) */
  else
    res = NULL; /* failure! */

  if(!res) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    free(addr);
    return CURLE_FTP_PORT_FAILED;
  }

  free(addr);
  host = NULL;

  /* step 2, create a socket for the requested address */

  portsock = CURL_SOCKET_BAD;
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    result = Curl_socket(data, ai, NULL, &portsock);
    if(result) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s",
          Curl_strerror(error, buffer, sizeof(buffer)));
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef ENABLE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local.  Use the address used for
         * the control connection instead and restart the port loop
         */
        infof(data, "bind(port=%hu) on non-local address failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
          Curl_closesocket(data, conn, portsock);
          return CURLE_FTP_PORT_FAILED;
        }
        port = port_min;
        possibly_non_local = FALSE; /* don't try this again */
        continue;
      }
      if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));
        Curl_closesocket(data, conn, portsock);
        return CURLE_FTP_PORT_FAILED;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already*/
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports");
    Curl_closesocket(data, conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, (struct sockaddr *)sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    Curl_closesocket(data, conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    Curl_closesocket(data, conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef ENABLE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is IPv4 only */
      continue;

    switch(sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef ENABLE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET?1:2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(data, conn, portsock);
        /* don't retry using PORT */
        ftpc->count1 = PORT;
        /* bail out */
        state(data, FTP_STOP);
        return result;
      }
      break;
    }
    if(PORT == fcmd) {
      /* large enough for [IP address],[num],[num] */
      char target[sizeof(myhost) + 20];
      char *source = myhost;
      char *dest = target;

      /* translate x.x.x.x to x,x,x,x */
      while(source && *source) {
        if(*source == '.')
          *dest = ',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      msnprintf(dest, 20, ",%d,%d", (int)(port>>8), (int)(port&0xff));

      result = Curl_pp_sendf(data, &ftpc->pp, "%s %s", mode[fcmd], target);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(data, conn, portsock);
        /* bail out */
        state(data, FTP_STOP);
        return result;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  close_secondarysocket(data, conn);

  /* we set the secondary socket variable to this for now, it is only so that
     the cleanup function will close it in case we fail before the true
     secondary stuff is made */
  conn->sock[SECONDARYSOCKET] = portsock;

  /* this tcpconnect assignment below is a hackish work-around to make the
     multi interface with active FTP work - as it will not wait for a
     (passive) connect in Curl_is_connected().

     The *proper* fix is to make sure that the active connection from the
     server is done in a non-blocking way. Currently, it is still BLOCKING.
  */
  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(data, FTP_PORT);
  return result;
}